

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corpus_test.cpp
# Opt level: O0

void __thiscall
crn::corpus_tester::print_comparative_metric_stats
          (corpus_tester *this,command_line_params *cmd_line_params,
          vector<crnlib::image_utils::error_metrics> *stats1,
          vector<crnlib::image_utils::error_metrics> *stats2,uint num_blocks_x,uint num_blocks_y)

{
  double dVar1;
  double dVar2;
  double dVar3;
  uint uVar4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint *puVar11;
  uint *puVar12;
  float *pKeys;
  error_metrics *peVar13;
  vector<unsigned_int> *local_230;
  vector<unsigned_int> *local_150;
  uint by;
  uint bx;
  uint block_index;
  uint i_1;
  uint *pSorted_indices;
  vector<unsigned_int> indices [2];
  float local_9c;
  error_metrics *local_98;
  error_metrics *em2;
  error_metrics *em1;
  undefined1 local_80 [4];
  uint i;
  vector<float> delta_psnr;
  vector<unsigned_int> worse_blocks;
  undefined1 local_50 [8];
  vector<unsigned_int> equal_blocks;
  vector<unsigned_int> better_blocks;
  uint num_blocks_y_local;
  uint num_blocks_x_local;
  vector<crnlib::image_utils::error_metrics> *stats2_local;
  vector<crnlib::image_utils::error_metrics> *stats1_local;
  command_line_params *cmd_line_params_local;
  corpus_tester *this_local;
  
  crnlib::vector<unsigned_int>::vector((vector<unsigned_int> *)&equal_blocks.m_size);
  crnlib::vector<unsigned_int>::vector((vector<unsigned_int> *)local_50);
  crnlib::vector<unsigned_int>::vector((vector<unsigned_int> *)&delta_psnr.m_size);
  crnlib::vector<float>::vector((vector<float> *)local_80);
  for (em1._4_4_ = 0; uVar4 = em1._4_4_,
      uVar6 = crnlib::vector<crnlib::image_utils::error_metrics>::size(stats1), uVar4 < uVar6;
      em1._4_4_ = em1._4_4_ + 1) {
    em2 = crnlib::vector<crnlib::image_utils::error_metrics>::operator[](stats1,em1._4_4_);
    local_98 = crnlib::vector<crnlib::image_utils::error_metrics>::operator[](stats2,em1._4_4_);
    if (local_98->mPeakSNR <= em2->mPeakSNR) {
      if (0.0010000000474974513 <= ABS(em2->mPeakSNR - local_98->mPeakSNR)) {
        crnlib::vector<unsigned_int>::push_back
                  ((vector<unsigned_int> *)&equal_blocks.m_size,(uint *)((long)&em1 + 4));
      }
      else {
        crnlib::vector<unsigned_int>::push_back
                  ((vector<unsigned_int> *)local_50,(uint *)((long)&em1 + 4));
      }
    }
    else {
      crnlib::vector<unsigned_int>::push_back
                ((vector<unsigned_int> *)&delta_psnr.m_size,(uint *)((long)&em1 + 4));
      local_9c = (float)(local_98->mPeakSNR - em2->mPeakSNR);
      crnlib::vector<float>::push_back((vector<float> *)local_80,&local_9c);
    }
  }
  uVar6 = crnlib::vector<unsigned_int>::size((vector<unsigned_int> *)&delta_psnr.m_size);
  uVar7 = crnlib::vector<unsigned_int>::size((vector<unsigned_int> *)&delta_psnr.m_size);
  uVar8 = crnlib::vector<crnlib::image_utils::error_metrics>::size(stats1);
  crnlib::console::printf
            ("Num worse blocks: %u, %3.3f%%",
             SUB84((double)(((float)uVar7 * 100.0) / (float)uVar8),0),(ulong)uVar6);
  uVar6 = crnlib::vector<unsigned_int>::size((vector<unsigned_int> *)local_50);
  uVar7 = crnlib::vector<unsigned_int>::size((vector<unsigned_int> *)local_50);
  uVar8 = crnlib::vector<crnlib::image_utils::error_metrics>::size(stats1);
  crnlib::console::printf
            ("Num equal blocks: %u, %3.3f%%",
             SUB84((double)(((float)uVar7 * 100.0) / (float)uVar8),0),(ulong)uVar6);
  uVar6 = crnlib::vector<unsigned_int>::size((vector<unsigned_int> *)&equal_blocks.m_size);
  uVar7 = crnlib::vector<unsigned_int>::size((vector<unsigned_int> *)&equal_blocks.m_size);
  uVar8 = crnlib::vector<crnlib::image_utils::error_metrics>::size(stats1);
  crnlib::console::printf
            ("Num better blocks: %u, %3.3f%%",
             SUB84((double)(((float)uVar7 * 100.0) / (float)uVar8),0),(ulong)uVar6);
  uVar6 = crnlib::vector<unsigned_int>::size((vector<unsigned_int> *)local_50);
  uVar7 = crnlib::vector<unsigned_int>::size((vector<unsigned_int> *)&equal_blocks.m_size);
  uVar8 = crnlib::vector<unsigned_int>::size((vector<unsigned_int> *)local_50);
  uVar9 = crnlib::vector<unsigned_int>::size((vector<unsigned_int> *)&equal_blocks.m_size);
  uVar10 = crnlib::vector<crnlib::image_utils::error_metrics>::size(stats1);
  crnlib::console::printf
            ("Num equal+better blocks: %u, %3.3f%%",
             SUB84((double)(((float)(uVar8 + uVar9) * 100.0) / (float)uVar10),0),
             (ulong)(uVar6 + uVar7));
  bVar5 = crnlib::command_line_params::has_key(cmd_line_params,"nobadblocks");
  if (!bVar5) {
    local_150 = (vector<unsigned_int> *)&pSorted_indices;
    do {
      crnlib::vector<unsigned_int>::vector(local_150);
      local_150 = local_150 + 1;
    } while (local_150 != (vector<unsigned_int> *)&indices[1].m_size);
    uVar6 = crnlib::vector<unsigned_int>::size((vector<unsigned_int> *)&delta_psnr.m_size);
    crnlib::vector<unsigned_int>::resize((vector<unsigned_int> *)&pSorted_indices,uVar6,false);
    uVar6 = crnlib::vector<unsigned_int>::size((vector<unsigned_int> *)&delta_psnr.m_size);
    crnlib::vector<unsigned_int>::resize((vector<unsigned_int> *)&indices[0].m_size,uVar6,false);
    uVar6 = crnlib::vector<unsigned_int>::size((vector<unsigned_int> *)&delta_psnr.m_size);
    if (uVar6 != 0) {
      uVar6 = crnlib::vector<unsigned_int>::size((vector<unsigned_int> *)&delta_psnr.m_size);
      puVar11 = crnlib::vector<unsigned_int>::operator[]((vector<unsigned_int> *)&pSorted_indices,0)
      ;
      puVar12 = crnlib::vector<unsigned_int>::operator[]
                          ((vector<unsigned_int> *)&indices[0].m_size,0);
      pKeys = crnlib::vector<float>::operator[]((vector<float> *)local_80,0);
      puVar11 = crnlib::indirect_radix_sort<unsigned_int,float>
                          (uVar6,puVar11,puVar12,pKeys,0,4,true);
      crnlib::console::printf("List of worse blocks sorted by delta PSNR:");
      for (bx = 0; uVar6 = crnlib::vector<unsigned_int>::size
                                     ((vector<unsigned_int> *)&delta_psnr.m_size), bx < uVar6;
          bx = bx + 1) {
        puVar12 = crnlib::vector<unsigned_int>::operator[]
                            ((vector<unsigned_int> *)&delta_psnr.m_size,puVar11[bx]);
        uVar4 = *puVar12;
        peVar13 = crnlib::vector<crnlib::image_utils::error_metrics>::operator[](stats1,uVar4);
        dVar1 = peVar13->mPeakSNR;
        peVar13 = crnlib::vector<crnlib::image_utils::error_metrics>::operator[](stats2,uVar4);
        dVar2 = peVar13->mPeakSNR;
        peVar13 = crnlib::vector<crnlib::image_utils::error_metrics>::operator[](stats2,uVar4);
        dVar3 = peVar13->mPeakSNR;
        peVar13 = crnlib::vector<crnlib::image_utils::error_metrics>::operator[](stats1,uVar4);
        crnlib::console::printf
                  ("%u. [%u,%u] %3.3f %3.3f %3.3f",SUB84(dVar1,0),dVar2,dVar3 - peVar13->mPeakSNR,
                   (ulong)bx,(ulong)(uVar4 % num_blocks_x),(ulong)(uVar4 / num_blocks_x));
      }
    }
    local_230 = (vector<unsigned_int> *)&indices[1].m_size;
    do {
      local_230 = local_230 + -1;
      crnlib::vector<unsigned_int>::~vector(local_230);
    } while (local_230 != (vector<unsigned_int> *)&pSorted_indices);
  }
  crnlib::vector<float>::~vector((vector<float> *)local_80);
  crnlib::vector<unsigned_int>::~vector((vector<unsigned_int> *)&delta_psnr.m_size);
  crnlib::vector<unsigned_int>::~vector((vector<unsigned_int> *)local_50);
  crnlib::vector<unsigned_int>::~vector((vector<unsigned_int> *)&equal_blocks.m_size);
  return;
}

Assistant:

void corpus_tester::print_comparative_metric_stats(const command_line_params& cmd_line_params, const crnlib::vector<image_utils::error_metrics>& stats1, const crnlib::vector<image_utils::error_metrics>& stats2, uint num_blocks_x, uint num_blocks_y)
    {
        num_blocks_y;

        crnlib::vector<uint> better_blocks;
        crnlib::vector<uint> equal_blocks;
        crnlib::vector<uint> worse_blocks;
        crnlib::vector<float> delta_psnr;

        for (uint i = 0; i < stats1.size(); i++)
        {
            //uint bx = i % num_blocks_x;
            //uint by = i / num_blocks_x;

            const image_utils::error_metrics& em1 = stats1[i];
            const image_utils::error_metrics& em2 = stats2[i];

            if (em1.mPeakSNR < em2.mPeakSNR)
            {
                worse_blocks.push_back(i);
                delta_psnr.push_back((float)(em2.mPeakSNR - em1.mPeakSNR));
            }
            else if (fabs(em1.mPeakSNR - em2.mPeakSNR) < .001f)
            {
                equal_blocks.push_back(i);
            }
            else
            {
                better_blocks.push_back(i);
            }
        }

        console::printf("Num worse blocks: %u, %3.3f%%", worse_blocks.size(), worse_blocks.size() * 100.0f / stats1.size());
        console::printf("Num equal blocks: %u, %3.3f%%", equal_blocks.size(), equal_blocks.size() * 100.0f / stats1.size());
        console::printf("Num better blocks: %u, %3.3f%%", better_blocks.size(), better_blocks.size() * 100.0f / stats1.size());
        console::printf("Num equal+better blocks: %u, %3.3f%%", equal_blocks.size() + better_blocks.size(), (equal_blocks.size() + better_blocks.size()) * 100.0f / stats1.size());

        if (!cmd_line_params.has_key("nobadblocks"))
        {
            crnlib::vector<uint> indices[2];
            indices[0].resize(worse_blocks.size());
            indices[1].resize(worse_blocks.size());

            uint* pSorted_indices = nullptr;
            if (worse_blocks.size())
            {
                pSorted_indices = indirect_radix_sort(worse_blocks.size(), &indices[0][0], &indices[1][0], &delta_psnr[0], 0, sizeof(float), true);

                console::printf("List of worse blocks sorted by delta PSNR:");
                for (uint i = 0; i < worse_blocks.size(); i++)
                {
                    uint block_index = worse_blocks[pSorted_indices[i]];
                    uint bx = block_index % num_blocks_x;
                    uint by = block_index / num_blocks_x;

                    console::printf("%u. [%u,%u] %3.3f %3.3f %3.3f",
                        i,
                        bx, by,
                        stats1[block_index].mPeakSNR,
                        stats2[block_index].mPeakSNR,
                        stats2[block_index].mPeakSNR - stats1[block_index].mPeakSNR);
                }
            }
        }
    }